

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_ObjSetMuxLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsMux(p,pObj);
  if (iVar1 != 0) {
    pGVar3 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ObjLevel(p,pGVar3);
    pGVar3 = Gia_ObjFanin1(pObj);
    iVar2 = Gia_ObjLevel(p,pGVar3);
    iVar1 = Abc_MaxInt(iVar1,iVar2);
    pGVar3 = Gia_ObjFanin2(p,pObj);
    iVar2 = Gia_ObjLevel(p,pGVar3);
    iVar1 = Abc_MaxInt(iVar1,iVar2);
    Gia_ObjSetLevel(p,pObj,iVar1 + 2);
    return;
  }
  __assert_fail("Gia_ObjIsMux(p,pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x243,"void Gia_ObjSetMuxLevel(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetMuxLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsMux(p,pObj) ); Gia_ObjSetLevel( p, pObj, 2+Abc_MaxInt( Abc_MaxInt(Gia_ObjLevel(p,Gia_ObjFanin0(pObj)),Gia_ObjLevel(p,Gia_ObjFanin1(pObj))), Gia_ObjLevel(p,Gia_ObjFanin2(p,pObj))) ); }